

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

char * __thiscall CTcMake::look_up_pp_sym(CTcMake *this,char *sym,size_t len)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  textchar_t *__s;
  CTcMakeDef *pCVar4;
  
  pCVar4 = (CTcMakeDef *)&this->def_head_;
  pcVar3 = (char *)0x0;
  while (pCVar4 = pCVar4->nxt_, pCVar4 != (CTcMakeDef *)0x0) {
    __s = (pCVar4->sym_).buf_;
    if (__s == (textchar_t *)0x0) {
      __s = "";
    }
    sVar2 = strlen(__s);
    if ((((sVar2 == len) && (iVar1 = bcmp(__s,sym,len), iVar1 == 0)) &&
        (pcVar3 = (char *)0x0, (pCVar4->field_0x18 & 1) != 0)) &&
       (pcVar3 = (pCVar4->expan_).buf_, pcVar3 == (char *)0x0)) {
      pcVar3 = "";
    }
  }
  return pcVar3;
}

Assistant:

const char *CTcMake::look_up_pp_sym(const char *sym, size_t len)
{
    CTcMakeDef *def;
    const char *found_val;

    /* iterate over our symbols to find this definition */
    for (found_val = 0, def = def_head_ ; def != 0 ; def = def->get_next())
    {
        /* if this one matches, note it */
        if (strlen(def->get_sym()) == len
            && memcmp(def->get_sym(), sym, len) == 0)
        {
            /* 
             *   it's a match - if this is a definition, remember it as the
             *   latest definition; if it's an undefinition, forget any
             *   previous definition we've noted 
             */
            found_val = (def->is_def() ? def->get_expan() : 0);
        }
    }

    /* return the definition we found, if any */
    return found_val;
}